

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStream::getReadBuffer(BufferedInputStream *this)

{
  undefined4 extraout_var;
  size_t extraout_RDX;
  ArrayPtr<const_unsigned_char> AVar1;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  AVar1.ptr._0_4_ = (*(this->super_InputStream)._vptr_InputStream[4])();
  AVar1.ptr._4_4_ = extraout_var;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = extraout_RDX != 0;
  if (_kjCondition.result) {
    AVar1.size_ = extraout_RDX;
    return AVar1;
  }
  _::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[14]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
             ,0x75,FAILED,"result.size() > 0","_kjCondition,\"Premature EOF\"",&_kjCondition,
             (char (*) [14])"Premature EOF");
  _::Debug::Fault::fatal(&f);
}

Assistant:

ArrayPtr<const byte> BufferedInputStream::getReadBuffer() {
  auto result = tryGetReadBuffer();
  KJ_REQUIRE(result.size() > 0, "Premature EOF");
  return result;
}